

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan_state.cpp
# Opt level: O2

void __thiscall duckdb::ScanFilterInfo::~ScanFilterInfo(ScanFilterInfo *this)

{
  ::std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            ((_Bvector_base<std::allocator<bool>_> *)&this->base_column_has_filter);
  ::std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            ((_Bvector_base<std::allocator<bool>_> *)&this->column_has_filter);
  ::std::vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>::~vector
            (&(this->filter_list).
              super_vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>);
  ::std::unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>_>::
  ~unique_ptr(&(this->adaptive_filter).
               super_unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>_>
             );
  return;
}

Assistant:

ScanFilterInfo::~ScanFilterInfo() {
}